

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::NameApplier::VisitFunc(NameApplier *this,Index func_index,Func *func)

{
  bool bVar1;
  Result RVar2;
  Index IVar3;
  Func *func_local;
  Index func_index_local;
  NameApplier *this_local;
  
  this->current_func_ = func;
  if (((func->decl).has_func_type & 1U) != 0) {
    RVar2 = UseNameForFuncTypeVar(this,&(func->decl).type_var);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  IVar3 = Func::GetNumParamsAndLocals(func);
  MakeTypeBindingReverseMapping((ulong)IVar3,&func->bindings,&this->param_and_local_index_to_name_);
  RVar2 = ExprVisitor::VisitFunc(&this->visitor_,func);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this->current_func_ = (Func *)0x0;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result NameApplier::VisitFunc(Index func_index, Func* func) {
  current_func_ = func;
  if (func->decl.has_func_type) {
    CHECK_RESULT(UseNameForFuncTypeVar(&func->decl.type_var));
  }

  MakeTypeBindingReverseMapping(func->GetNumParamsAndLocals(), func->bindings,
                                &param_and_local_index_to_name_);

  CHECK_RESULT(visitor_.VisitFunc(func));
  current_func_ = nullptr;
  return Result::Ok;
}